

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetLinearSolver(void *kinmem,SUNLinearSolver LS,SUNMatrix A)

{
  SUNLinearSolver_Type SVar1;
  int iVar2;
  KINLsMem kinls_mem_00;
  bool local_41;
  int LSType;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  SUNMatrix A_local;
  SUNLinearSolver LS_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINLS","KINSetLinearSolver","KINSOL memory is NULL.");
    kinmem_local._4_4_ = -1;
  }
  else if (LS == (SUNLinearSolver)0x0) {
    KINProcessError((KINMem)0x0,-3,"KINLS","KINSetLinearSolver","LS must be non-NULL");
    kinmem_local._4_4_ = -3;
  }
  else if ((((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
            (LS->ops->initialize == (_func_int_SUNLinearSolver *)0x0)) ||
           (LS->ops->setup == (_func_int_SUNLinearSolver_SUNMatrix *)0x0)) ||
          (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0))
  {
    KINProcessError((KINMem)kinmem,-3,"KINLS","KINSetLinearSolver",
                    "LS object is missing a required operation");
    kinmem_local._4_4_ = -3;
  }
  else if ((*(long *)(*(long *)(*(long *)((long)kinmem + 0x140) + 8) + 0x40) == 0) ||
          (*(long *)(*(long *)(*(long *)((long)kinmem + 0x140) + 8) + 0x78) == 0)) {
    KINProcessError((KINMem)kinmem,-3,"KINLS","KINSetLinearSolver",
                    "A required vector operation is not implemented.");
    kinmem_local._4_4_ = -3;
  }
  else {
    SVar1 = SUNLinSolGetType(LS);
    if ((SVar1 == SUNLINEARSOLVER_ITERATIVE) &&
       (LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0)) {
      KINProcessError((KINMem)kinmem,-3,"KINLS","KINSetLinearSolver",
                      "Incompatible inputs: iterative LS must support ATimes routine");
      kinmem_local._4_4_ = -3;
    }
    else if ((SVar1 == SUNLINEARSOLVER_DIRECT) && (A == (SUNMatrix)0x0)) {
      KINProcessError((KINMem)kinmem,-3,"KINLS","KINSetLinearSolver",
                      "Incompatible inputs: direct LS requires non-NULL matrix");
      kinmem_local._4_4_ = -3;
    }
    else if ((SVar1 == SUNLINEARSOLVER_MATRIX_ITERATIVE) && (A == (SUNMatrix)0x0)) {
      KINProcessError((KINMem)kinmem,-3,"KINLS","KINSetLinearSolver",
                      "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      kinmem_local._4_4_ = -3;
    }
    else {
      if (*(long *)((long)kinmem + 0x1e8) != 0) {
        (**(code **)((long)kinmem + 0x1e8))(kinmem);
      }
      local_41 = SVar1 == SUNLINEARSOLVER_ITERATIVE || SVar1 == SUNLINEARSOLVER_MATRIX_ITERATIVE;
      *(uint *)((long)kinmem + 0x1f0) = (uint)local_41;
      *(code **)((long)kinmem + 0x1d0) = kinLsInitialize;
      *(code **)((long)kinmem + 0x1d8) = kinLsSetup;
      *(code **)((long)kinmem + 0x1e0) = kinLsSolve;
      *(code **)((long)kinmem + 0x1e8) = kinLsFree;
      kinls_mem_00 = (KINLsMem)malloc(0xb0);
      if (kinls_mem_00 == (KINLsMem)0x0) {
        KINProcessError((KINMem)kinmem,-4,"KINLS","KINSetLinearSolver","A memory request failed.");
        kinmem_local._4_4_ = -4;
      }
      else {
        memset(kinls_mem_00,0,0xb0);
        kinls_mem_00->LS = LS;
        if (A == (SUNMatrix)0x0) {
          kinls_mem_00->jacDQ = 0;
          kinls_mem_00->jac = (KINLsJacFn)0x0;
          kinls_mem_00->J_data = (void *)0x0;
        }
        else {
          kinls_mem_00->jacDQ = 1;
          kinls_mem_00->jac = kinLsDQJac;
          kinls_mem_00->J_data = kinmem;
        }
        kinls_mem_00->jtimesDQ = 1;
        kinls_mem_00->jtimes = kinLsDQJtimes;
        kinls_mem_00->jt_data = kinmem;
        kinls_mem_00->pset = (KINLsPrecSetupFn)0x0;
        kinls_mem_00->psolve = (KINLsPrecSolveFn)0x0;
        kinls_mem_00->pfree = (_func_int_KINMem *)0x0;
        kinls_mem_00->pdata = *(void **)((long)kinmem + 0x10);
        kinLsInitializeCounters(kinls_mem_00);
        kinls_mem_00->last_flag = 0;
        if ((LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0) ||
           (iVar2 = SUNLinSolSetATimes(LS,kinmem,kinLsATimes), iVar2 == 0)) {
          if ((LS->ops->setpreconditioner ==
               (_func_int_SUNLinearSolver_void_ptr_PSetupFn_PSolveFn *)0x0) ||
             (iVar2 = SUNLinSolSetPreconditioner(LS,kinmem,(PSetupFn)0x0,(PSolveFn)0x0), iVar2 == 0)
             ) {
            kinls_mem_00->tol_fac = -1.0;
            kinls_mem_00->J = A;
            *(KINLsMem *)((long)kinmem + 0x1f8) = kinls_mem_00;
            kinmem_local._4_4_ = 0;
          }
          else {
            KINProcessError((KINMem)kinmem,-8,"KINLS","KINSetLinearSolver",
                            "Error in calling SUNLinSolSetPreconditioner");
            free(kinls_mem_00);
            kinmem_local._4_4_ = -8;
          }
        }
        else {
          KINProcessError((KINMem)kinmem,-8,"KINLS","KINSetLinearSolver",
                          "Error in calling SUNLinSolSetATimes");
          free(kinls_mem_00);
          kinmem_local._4_4_ = -8;
        }
      }
    }
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetLinearSolver(void *kinmem, SUNLinearSolver LS, SUNMatrix A)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval, LSType;

  /* Return immediately if either kinmem or LS inputs are NULL */
  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_KINMEM_NULL);
    return(KINLS_MEM_NULL);
  }
  if (LS == NULL) {
    KINProcessError(NULL, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver",
                    "LS must be non-NULL");
    return(KINLS_ILL_INPUT);
  }
  kin_mem = (KINMem) kinmem;

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) ||
       (LS->ops->initialize == NULL) ||
       (LS->ops->setup == NULL) ||
       (LS->ops->solve == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                   "KINSetLinearSolver",
                   "LS object is missing a required operation");
    return(KINLS_ILL_INPUT);
  }

  /* check for required vector operations for KINLS interface */
  if ( (kin_mem->kin_vtemp1->ops->nvconst == NULL) ||
       (kin_mem->kin_vtemp1->ops->nvdotprod == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver", MSG_LS_BAD_NVECTOR);
    return(KINLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Check for compatible LS type, matrix and "atimes" support */
  if ((LSType == SUNLINEARSOLVER_ITERATIVE) && (LS->ops->setatimes == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: iterative LS must support ATimes routine");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_DIRECT) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }

  /* free any existing system solver attached to KIN */
  if (kin_mem->kin_lfree) kin_mem->kin_lfree(kin_mem);

  /* Determine if this is an iterative linear solver */
  kin_mem->kin_inexact_ls = ( (LSType == SUNLINEARSOLVER_ITERATIVE) ||
                              (LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) );

  /* Set four main system linear solver function fields in kin_mem */
  kin_mem->kin_linit  = kinLsInitialize;
  kin_mem->kin_lsetup = kinLsSetup;
  kin_mem->kin_lsolve = kinLsSolve;
  kin_mem->kin_lfree  = kinLsFree;

  /* Get memory for KINLsMemRec */
  kinls_mem = NULL;
  kinls_mem = (KINLsMem) malloc(sizeof(struct KINLsMemRec));
  if (kinls_mem == NULL) {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }
  memset(kinls_mem, 0, sizeof(struct KINLsMemRec));

  /* set SUNLinearSolver pointer */
  kinls_mem->LS = LS;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL) {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  } else {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = NULL;
    kinls_mem->J_data = NULL;
  }
  kinls_mem->jtimesDQ = SUNTRUE;
  kinls_mem->jtimes   = kinLsDQJtimes;
  kinls_mem->jt_data  = kin_mem;

  /* Set defaults for preconditioner-related fields */
  kinls_mem->pset   = NULL;
  kinls_mem->psolve = NULL;
  kinls_mem->pfree  = NULL;
  kinls_mem->pdata  = kin_mem->kin_user_data;

  /* Initialize counters */
  kinLsInitializeCounters(kinls_mem);

  /* Set default values for the rest of the LS parameters */
  kinls_mem->last_flag = KINLS_SUCCESS;

  /* If LS supports ATimes, attach KINLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, kin_mem, kinLsATimes);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetATimes");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, kin_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetPreconditioner");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* initialize tolerance scaling factor */
  kinls_mem->tol_fac = -ONE;

  /* set SUNMatrix pointer (can be NULL) */
  kinls_mem->J = A;

  /* Attach linear solver memory to integrator memory */
  kin_mem->kin_lmem = kinls_mem;

  return(KINLS_SUCCESS);
}